

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_chunk(Integer g_a,Integer *chunk)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer i;
  Integer in_stack_00000178;
  char *in_stack_00000180;
  long local_18;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  if (in_RSI != 0) {
    for (local_18 = 0; local_18 < GA[lVar1].ndim; local_18 = local_18 + 1) {
      GA[lVar1].chunk[local_18] = *(C_Integer *)(in_RSI + local_18 * 8);
    }
  }
  return;
}

Assistant:

void pnga_set_chunk(Integer g_a, Integer *chunk)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set chunk on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before chunk array is specified",0);
  if (chunk) {
    for (i=0; i<GA[ga_handle].ndim; i++) {
      GA[ga_handle].chunk[i] = (C_Integer)chunk[i];
    }
  }
}